

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

TestRole __thiscall testing::internal::NoExecDeathTest::AssumeRole(NoExecDeathTest *this)

{
  int iVar1;
  __pid_t _Var2;
  size_t sVar3;
  int *piVar4;
  UnitTestImpl *pUVar5;
  undefined8 extraout_RAX;
  TestRole TVar6;
  char *pcVar7;
  ostream *poVar8;
  allocator<char> local_125;
  int local_124;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100;
  int pipe_fd [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  sVar3 = GetThreadCount();
  if (sVar3 != 1) {
    GTestLog::GTestLog((GTestLog *)&local_d8,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/googletest/googletest/src/gtest-death-test.cc"
                       ,0x464);
    Message::Message((Message *)&local_120);
    std::operator<<((ostream *)(local_120._M_dataplus._M_p + 0x10),
                    "Death tests use fork(), which is unsafe particularly");
    std::operator<<((ostream *)(local_120._M_dataplus._M_p + 0x10),
                    " in a threaded context. For this test, ");
    std::operator<<((ostream *)(local_120._M_dataplus._M_p + 0x10),"Google Test");
    std::operator<<((ostream *)(local_120._M_dataplus._M_p + 0x10)," ");
    poVar8 = (ostream *)(local_120._M_dataplus._M_p + 0x10);
    if (sVar3 == 0) {
      pcVar7 = "couldn\'t detect the number of threads.";
    }
    else {
      std::operator<<(poVar8,"detected ");
      std::ostream::_M_insert<unsigned_long>((ulong)(local_120._M_dataplus._M_p + 0x10));
      poVar8 = (ostream *)(local_120._M_dataplus._M_p + 0x10);
      pcVar7 = " threads.";
    }
    std::operator<<(poVar8,pcVar7);
    std::operator<<((ostream *)(local_120._M_dataplus._M_p + 0x10),
                    " See https://github.com/google/googletest/blob/master/docs/advanced.md#death-tests-and-threads"
                   );
    std::operator<<((ostream *)(local_120._M_dataplus._M_p + 0x10),
                    " for more explanation and suggested solutions, especially if");
    std::operator<<((ostream *)(local_120._M_dataplus._M_p + 0x10),
                    " this is the last message you see before your test times out.");
    StringStreamToString(&local_100,(stringstream *)local_120._M_dataplus._M_p);
    if ((stringstream *)local_120._M_dataplus._M_p != (stringstream *)0x0) {
      (**(code **)(*(long *)local_120._M_dataplus._M_p + 8))();
    }
    std::operator<<((ostream *)&std::cerr,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    GTestLog::~GTestLog((GTestLog *)&local_d8);
  }
  iVar1 = pipe(pipe_fd);
  if (iVar1 == -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"CHECK failed: File ",(allocator<char> *)&local_124);
    std::operator+(&local_78,&local_98,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/googletest/googletest/src/gtest-death-test.cc"
                  );
    std::operator+(&local_58,&local_78,", line ");
    local_38._M_dataplus._M_p._0_4_ = 0x468;
    StreamableToString<int>(&local_b8,(int *)&local_38);
    std::operator+(&local_d8,&local_58,&local_b8);
    std::operator+(&local_120,&local_d8,": ");
    std::operator+(&local_100,&local_120,"pipe(pipe_fd) != -1");
    DeathTestAbort(&local_100);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"",(allocator<char> *)&local_120);
    DeathTest::set_last_death_test_message(&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    CaptureStderr();
    FlushInfoLog();
    _Var2 = fork();
    if (_Var2 != -1) {
      *(__pid_t *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = _Var2;
      if (_Var2 == 0) {
        TVar6 = EXECUTE_TEST;
        do {
          iVar1 = close(pipe_fd[0]);
          if (iVar1 != -1) goto LAB_00142cec;
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,"CHECK failed: File ",&local_125);
        std::operator+(&local_98,&local_b8,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/googletest/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_78,&local_98,", line ");
        local_124 = 0x479;
        StreamableToString<int>(&local_38,&local_124);
        std::operator+(&local_58,&local_78,&local_38);
        std::operator+(&local_d8,&local_58,": ");
        std::operator+(&local_120,&local_d8,"close(pipe_fd[0])");
        std::operator+(&local_100,&local_120," != -1");
        DeathTestAbort(&local_100);
LAB_00142cec:
        (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pipe_fd[1];
        pUVar5 = GetUnitTestImpl();
        ((pUVar5->listeners_).repeater_)->forwarding_enabled_ = false;
        g_in_fast_death_test_child = 1;
      }
      else {
        do {
          iVar1 = close(pipe_fd[1]);
          if (iVar1 != -1) goto LAB_00142bec;
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,"CHECK failed: File ",&local_125);
        std::operator+(&local_98,&local_b8,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/googletest/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_78,&local_98,", line ");
        local_124 = 0x485;
        StreamableToString<int>(&local_38,&local_124);
        std::operator+(&local_58,&local_78,&local_38);
        std::operator+(&local_d8,&local_58,": ");
        std::operator+(&local_120,&local_d8,"close(pipe_fd[1])");
        std::operator+(&local_100,&local_120," != -1");
        DeathTestAbort(&local_100);
LAB_00142bec:
        (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = pipe_fd[0];
        (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
        TVar6 = OVERSEE_TEST;
      }
      return TVar6;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"CHECK failed: File ",(allocator<char> *)&local_124);
  std::operator+(&local_78,&local_98,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/googletest/googletest/src/gtest-death-test.cc"
                );
  std::operator+(&local_58,&local_78,", line ");
  local_38._M_dataplus._M_p._0_4_ = 0x476;
  StreamableToString<int>(&local_b8,(int *)&local_38);
  std::operator+(&local_d8,&local_58,&local_b8);
  std::operator+(&local_120,&local_d8,": ");
  std::operator+(&local_100,&local_120,"child_pid != -1");
  DeathTestAbort(&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

DeathTest::TestRole NoExecDeathTest::AssumeRole() {
  const size_t thread_count = GetThreadCount();
  if (thread_count != 1) {
    GTEST_LOG_(WARNING) << DeathTestThreadWarning(thread_count);
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);

  DeathTest::set_last_death_test_message("");
  CaptureStderr();
  // When we fork the process below, the log file buffers are copied, but the
  // file descriptors are shared.  We flush all log files here so that closing
  // the file descriptors in the child process doesn't throw off the
  // synchronization between descriptors and buffers in the parent process.
  // This is as close to the fork as possible to avoid a race condition in case
  // there are multiple threads running before the death test, and another
  // thread writes to the log file.
  FlushInfoLog();

  const pid_t child_pid = fork();
  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  set_child_pid(child_pid);
  if (child_pid == 0) {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[0]));
    set_write_fd(pipe_fd[1]);
    // Redirects all logging to stderr in the child process to prevent
    // concurrent writes to the log files.  We capture stderr in the parent
    // process and append the child process' output to a log.
    LogToStderr();
    // Event forwarding to the listeners of event listener API mush be shut
    // down in death test subprocesses.
    GetUnitTestImpl()->listeners()->SuppressEventForwarding();
    g_in_fast_death_test_child = true;
    return EXECUTE_TEST;
  } else {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
    set_read_fd(pipe_fd[0]);
    set_spawned(true);
    return OVERSEE_TEST;
  }
}